

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

vector<long_long,_std::allocator<long_long>_> *
hiberlite::Database::dbSelectChildIds
          (vector<long_long,_std::allocator<long_long>_> *__return_storage_ptr__,
          shared_connection *con,string *table,sqlid_t parent)

{
  size_type *psVar1;
  int *piVar2;
  shared_cnt_obj_pair<hiberlite::autoclosed_con> *psVar3;
  pointer pcVar4;
  long *plVar5;
  undefined8 *puVar6;
  ulong *puVar7;
  ulong uVar8;
  undefined8 uVar9;
  string local_108;
  ulong *local_e8;
  longlong *local_e0;
  ulong local_d8;
  long lStack_d0;
  string local_c8;
  sqlid_t local_a8;
  shared_connection local_a0;
  string local_90;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  string local_50;
  
  local_a0._vptr_shared_res = (_func_int **)&PTR__shared_res_001d3578;
  psVar3 = con->res;
  if (psVar3 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    psVar3->refCount = psVar3->refCount + 1;
  }
  pcVar4 = (table->_M_dataplus)._M_p;
  local_a8 = parent;
  local_a0.res = psVar3;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar4,pcVar4 + table->_M_string_length);
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"hiberlite_parent_id","");
  plVar5 = (long *)std::__cxx11::string::append((char *)local_70);
  puVar7 = (ulong *)(plVar5 + 2);
  if ((ulong *)*plVar5 == puVar7) {
    local_d8 = *puVar7;
    lStack_d0 = plVar5[3];
    local_e8 = &local_d8;
  }
  else {
    local_d8 = *puVar7;
    local_e8 = (ulong *)*plVar5;
  }
  local_e0 = (longlong *)plVar5[1];
  *plVar5 = (long)puVar7;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  Transformer::toSQLiteValue_abi_cxx11_(&local_c8,(Transformer *)&local_a8,local_e0);
  uVar8 = 0xf;
  if (local_e8 != &local_d8) {
    uVar8 = local_d8;
  }
  if (uVar8 < local_c8._M_string_length + (long)local_e0) {
    uVar9 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      uVar9 = local_c8.field_2._M_allocated_capacity;
    }
    if (local_c8._M_string_length + (long)local_e0 <= (ulong)uVar9) {
      puVar6 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_c8,0,(char *)0x0,(ulong)local_e8);
      goto LAB_00145820;
    }
  }
  puVar6 = (undefined8 *)
           std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_c8._M_dataplus._M_p);
LAB_00145820:
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  psVar1 = puVar6 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar6 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar1) {
    local_108.field_2._M_allocated_capacity = *psVar1;
    local_108.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
    local_108.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
  }
  else {
    local_108.field_2._M_allocated_capacity = *psVar1;
    local_108._M_dataplus._M_p = (pointer)*puVar6;
  }
  local_108._M_string_length = puVar6[1];
  *puVar6 = psVar1;
  puVar6[1] = 0;
  *(undefined1 *)psVar1 = 0;
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"hiberlite_entry_indx","");
  dbSelectIds(__return_storage_ptr__,&local_a0,&local_50,&local_108,&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p);
  }
  if (local_e8 != &local_d8) {
    operator_delete(local_e8);
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (psVar3 != (shared_cnt_obj_pair<hiberlite::autoclosed_con> *)0x0) {
    piVar2 = &psVar3->refCount;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*psVar3->_vptr_shared_cnt_obj_pair[1])(psVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<sqlid_t> Database::dbSelectChildIds(shared_connection con, std::string table, sqlid_t parent)
{
	return dbSelectIds(con, table, std::string(HIBERLITE_PARENTID_COLUMN)+"="+Transformer::toSQLiteValue(parent)
									, HIBERLITE_ENTRY_INDEX_COLUMN);
}